

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O2

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::applyRotatorFromLeft
          (BidiagonalMatrix *this,Rotator *r,int n,double bulge)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  double dVar8;
  
  pdVar4 = this->pBlock;
  lVar7 = (long)(n * 2);
  dVar8 = pdVar4[lVar7 + 2];
  dVar5 = r->elements[0];
  dVar1 = r->elements[2];
  dVar2 = r->elements[3];
  dVar6 = (pdVar4 + lVar7)[1];
  dVar3 = r->elements[1];
  pdVar4[lVar7] = dVar5 * pdVar4[lVar7] + bulge * dVar1;
  (pdVar4 + lVar7)[1] = dVar5 * dVar6 + dVar8 * dVar1;
  pdVar4[lVar7 + 2] = dVar8 * dVar2 + dVar6 * dVar3;
  dVar8 = 0.0;
  if (n < 0x30) {
    dVar8 = dVar1 * pdVar4[lVar7 + 3];
    pdVar4[lVar7 + 3] = dVar2 * pdVar4[lVar7 + 3];
  }
  return dVar8;
}

Assistant:

double applyRotatorFromLeft(const Rotator& r, int n, double bulge) {
				double* p = this->pBlock + n * 2;
				double b1 = p[0];
				double g1 = p[1];
				double b2 = p[2];
				double r11 = r(0, 0);
				double r12 = r(0, 1);
				double r21 = r(1, 0);
				double r22 = r(1, 1);
				p[0] = r11 * b1 + r21 * bulge;
				p[1] = r11 * g1 + r21 * b2;
				p[2] = r12 * g1 + r22 * b2;
				double newBulge;
				if (n < N - 2) {
					double g2 = p[3];
					newBulge = r21 * g2;
					p[3] = r22 * g2;
				} else {
					newBulge = 0.0;
				}
				return newBulge;
			}